

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O3

XVisualInfo *
sf::priv::GlxContext::selectBestVisual
          (XVisualInfo *__return_storage_ptr__,Display *display,uint bitsPerPixel,
          ContextSettings *settings)

{
  int iVar1;
  Visual *pVVar2;
  VisualID VVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  XVisualInfo *pXVar13;
  ostream *poVar14;
  long lVar15;
  int iVar16;
  bool sRgb_00;
  int sRgb;
  int samples;
  int multiSampling;
  int count;
  uint local_60;
  int stencil;
  int depth;
  int alpha;
  int blue;
  int green;
  int red;
  int doubleBuffer;
  XVisualInfo *local_40;
  ContextSettings *local_38;
  
  local_60 = bitsPerPixel;
  local_38 = settings;
  anon_unknown.dwarf_5cf656::ensureExtensionsInit(display,*(int *)(display + 0xe0));
  iVar1 = *(int *)(display + 0xe0);
  pXVar13 = (XVisualInfo *)XGetVisualInfo(display,0,0,&count);
  local_40 = pXVar13;
  if (pXVar13 == (XVisualInfo *)0x0) {
    poVar14 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"No GLX visual found. You should check your graphics driver",0x3a);
    std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    __return_storage_ptr__->visual = (Visual *)0x0;
    __return_storage_ptr__->visualid = 0;
    __return_storage_ptr__->screen = 0;
    __return_storage_ptr__->depth = 0;
    *(undefined8 *)&__return_storage_ptr__->c_class = 0;
    __return_storage_ptr__->red_mask = 0;
    __return_storage_ptr__->green_mask = 0;
    __return_storage_ptr__->blue_mask = 0;
    __return_storage_ptr__->colormap_size = 0;
    __return_storage_ptr__->bits_per_rgb = 0;
  }
  else {
    __return_storage_ptr__->blue_mask = 0;
    __return_storage_ptr__->colormap_size = 0;
    __return_storage_ptr__->bits_per_rgb = 0;
    __return_storage_ptr__->red_mask = 0;
    __return_storage_ptr__->green_mask = 0;
    __return_storage_ptr__->screen = 0;
    __return_storage_ptr__->depth = 0;
    *(undefined8 *)&__return_storage_ptr__->c_class = 0;
    __return_storage_ptr__->visual = (Visual *)0x0;
    __return_storage_ptr__->visualid = 0;
    if (0 < count) {
      iVar16 = 0x7fffffff;
      lVar15 = 0;
      iVar11 = count;
      do {
        if ((pXVar13->screen == iVar1) &&
           ((*sf_glad_glXGetConfig)(display,pXVar13,5,&doubleBuffer), iVar11 = count,
           doubleBuffer != 0)) {
          (*sf_glad_glXGetConfig)(display,pXVar13,8,&red);
          (*sf_glad_glXGetConfig)(display,pXVar13,9,&green);
          (*sf_glad_glXGetConfig)(display,pXVar13,10,&blue);
          (*sf_glad_glXGetConfig)(display,pXVar13,0xb,&alpha);
          (*sf_glad_glXGetConfig)(display,pXVar13,0xc,&depth);
          (*sf_glad_glXGetConfig)(display,pXVar13,0xd,&stencil);
          if (SF_GLAD_GLX_ARB_multisample == 0) {
            multiSampling = 0;
            samples = 0;
          }
          else {
            (*sf_glad_glXGetConfig)(display,pXVar13,100000,&multiSampling);
            (*sf_glad_glXGetConfig)(display,pXVar13,0x186a1,&samples);
          }
          if (SF_GLAD_GLX_ARB_framebuffer_sRGB == 0 && SF_GLAD_GLX_EXT_framebuffer_sRGB == 0) {
            sRgb = 0;
            sRgb_00 = false;
          }
          else {
            (*sf_glad_glXGetConfig)(display,pXVar13,0x20b2,&sRgb);
            sRgb_00 = sRgb == 1;
          }
          iVar11 = multiSampling;
          if (multiSampling != 0) {
            iVar11 = samples;
          }
          iVar12 = GlContext::evaluateFormat
                             (local_60,local_38,green + red + blue + alpha,depth,stencil,iVar11,true
                              ,sRgb_00);
          iVar11 = count;
          if (iVar12 < iVar16) {
            pVVar2 = pXVar13->visual;
            VVar3 = pXVar13->visualid;
            iVar7 = pXVar13->screen;
            iVar8 = pXVar13->depth;
            iVar9 = pXVar13->c_class;
            uVar10 = *(undefined4 *)&pXVar13->field_0x1c;
            uVar4 = pXVar13->red_mask;
            uVar5 = pXVar13->green_mask;
            iVar16 = pXVar13->colormap_size;
            iVar6 = pXVar13->bits_per_rgb;
            __return_storage_ptr__->blue_mask = pXVar13->blue_mask;
            __return_storage_ptr__->colormap_size = iVar16;
            __return_storage_ptr__->bits_per_rgb = iVar6;
            __return_storage_ptr__->red_mask = uVar4;
            __return_storage_ptr__->green_mask = uVar5;
            __return_storage_ptr__->screen = iVar7;
            __return_storage_ptr__->depth = iVar8;
            __return_storage_ptr__->c_class = iVar9;
            *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar10;
            __return_storage_ptr__->visual = pVVar2;
            __return_storage_ptr__->visualid = VVar3;
            iVar16 = iVar12;
          }
        }
        lVar15 = lVar15 + 1;
        pXVar13 = pXVar13 + 1;
      } while (lVar15 < iVar11);
    }
    XFree(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

XVisualInfo GlxContext::selectBestVisual(::Display* display, unsigned int bitsPerPixel, const ContextSettings& settings)
{
    // Make sure that extensions are initialized
    ensureExtensionsInit(display, DefaultScreen(display));

    const int screen = DefaultScreen(display);

    // Retrieve all the visuals
    int count;
    XVisualInfo* visuals = XGetVisualInfo(display, 0, NULL, &count);
    if (visuals)
    {
        // Evaluate all the returned visuals, and pick the best one
        int bestScore = 0x7FFFFFFF;
        XVisualInfo bestVisual = XVisualInfo();
        for (int i = 0; i < count; ++i)
        {
            // Filter by screen
            if (visuals[i].screen != screen)
                continue;

            // Check mandatory attributes
            int doubleBuffer;
            glXGetConfig(display, &visuals[i], GLX_DOUBLEBUFFER, &doubleBuffer);
            if (!doubleBuffer)
                continue;

            // Extract the components of the current visual
            int red, green, blue, alpha, depth, stencil, multiSampling, samples, sRgb;
            glXGetConfig(display, &visuals[i], GLX_RED_SIZE,     &red);
            glXGetConfig(display, &visuals[i], GLX_GREEN_SIZE,   &green);
            glXGetConfig(display, &visuals[i], GLX_BLUE_SIZE,    &blue);
            glXGetConfig(display, &visuals[i], GLX_ALPHA_SIZE,   &alpha);
            glXGetConfig(display, &visuals[i], GLX_DEPTH_SIZE,   &depth);
            glXGetConfig(display, &visuals[i], GLX_STENCIL_SIZE, &stencil);

            if (SF_GLAD_GLX_ARB_multisample)
            {
                glXGetConfig(display, &visuals[i], GLX_SAMPLE_BUFFERS_ARB, &multiSampling);
                glXGetConfig(display, &visuals[i], GLX_SAMPLES_ARB,        &samples);
            }
            else
            {
                multiSampling = 0;
                samples = 0;
            }

            if (SF_GLAD_GLX_EXT_framebuffer_sRGB || SF_GLAD_GLX_ARB_framebuffer_sRGB)
            {
                glXGetConfig(display, &visuals[i], GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB, &sRgb);
            }
            else
            {
                sRgb = 0;
            }

            // TODO: Replace this with proper acceleration detection
            bool accelerated = true;

            // Evaluate the visual
            int color = red + green + blue + alpha;
            int score = evaluateFormat(bitsPerPixel, settings, color, depth, stencil, multiSampling ? samples : 0, accelerated, sRgb == True);

            // If it's better than the current best, make it the new best
            if (score < bestScore)
            {
                bestScore = score;
                bestVisual = visuals[i];
            }
        }

        // Free the array of visuals
        XFree(visuals);

        return bestVisual;
    }
    else
    {
        // Should never happen...
        err() << "No GLX visual found. You should check your graphics driver" << std::endl;

        return XVisualInfo();
    }
}